

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void help(void)

{
  fwrite("-a set allocrule (default none)\n-o general optimization off\n-M max level (optional)\n-p inputpath (relative or full path)\n-n feed net value (used for reinsurance)\n-O Alloc rule2 optimization off-d debug\n-v version\n-h help\n"
         ,0xdd,1,_stderr);
  return;
}

Assistant:

void help()
{

    fprintf(stderr,
		"-a set allocrule (default none)\n"
		"-o general optimization off\n"
        "-M max level (optional)\n"
		"-p inputpath (relative or full path)\n"
		"-n feed net value (used for reinsurance)\n"
		"-O Alloc rule2 optimization off"
		"-d debug\n"
		"-v version\n"
		"-h help\n"
	);
}